

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::region::as_string_abi_cxx11_(string *__return_storage_ptr__,region *this)

{
  element_type *peVar1;
  long lVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  allocator<char> local_9;
  
  peVar1 = (this->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_9)
    ;
  }
  else {
    lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__return_storage_ptr__,(detail *)(this->first_ + lVar2),
               (uchar *)(lVar2 + this->last_),in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string region::as_string() const
{
    if(this->is_ok())
    {
        const auto begin = std::next(this->source_->cbegin(), static_cast<difference_type>(this->first_));
        const auto end   = std::next(this->source_->cbegin(), static_cast<difference_type>(this->last_ ));
        return ::toml::detail::make_string(begin, end);
    }
    else
    {
        return std::string("");
    }
}